

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

string * nivalis::util::str_replace
                   (string *__return_storage_ptr__,string_view src,string *from,string_view to)

{
  ulong uVar1;
  pointer pcVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  vector<unsigned_long,_std::allocator<unsigned_long>_> za;
  allocator_type local_59;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  char *local_50;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_50 = to._M_str;
  uVar1 = from->_M_string_length;
  std::__cxx11::string::push_back((char)from);
  std::__cxx11::string::append((char *)from,(ulong)src._M_str);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_48,from->_M_string_length,&local_59);
  uVar5 = from->_M_string_length;
  *local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = uVar5;
  if (1 < uVar5) {
    uVar3 = 1;
    lVar4 = -1;
    uVar6 = 0;
    uVar7 = 0;
    do {
      if ((uVar7 < uVar3) ||
         ((uVar7 - uVar3) + 1 <=
          local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3 - uVar6])) {
        if (uVar7 < uVar3) {
          uVar7 = uVar3;
        }
        uVar6 = uVar7;
        if (uVar7 < uVar5) {
          pcVar2 = (from->_M_dataplus)._M_p;
          do {
            uVar6 = uVar7;
            if (pcVar2[uVar7] != pcVar2[uVar7 + lVar4]) break;
            uVar7 = uVar7 + 1;
            uVar6 = uVar5;
          } while (uVar7 < uVar5);
        }
        local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] = uVar6 - uVar3;
        uVar7 = uVar6 - 1;
        uVar6 = uVar3;
      }
      else {
        local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar3] =
             local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3 - uVar6];
      }
      uVar3 = uVar3 + 1;
      uVar5 = from->_M_string_length;
      lVar4 = lVar4 + -1;
    } while (uVar3 < uVar5);
  }
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar5 = uVar1 + 1;
  uVar7 = uVar1;
  if (uVar5 < from->_M_string_length) {
    do {
      if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar5] < uVar1) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        uVar7 = uVar5;
      }
      else {
        std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_50);
        uVar7 = uVar7 + uVar1;
      }
      uVar5 = uVar7 + 1;
    } while (uVar5 < from->_M_string_length);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str_replace(std::string_view src, std::string from, std::string_view to) {
    size_t sz = from.size();
    from.push_back('\v'); from.append(src);

    std::vector<size_t> za(from.size());
    za[0] = from.size();
    size_t left = 0, right = 0;
    for (size_t i = 1; i < from.size(); ++i) {
        if (right >= i && size_t(za[i - left]) < right - i + 1) za[i] = za[i - left];
        else {
            left = i; right = std::max(i, right);
            while (right < from.size() && from[right] == from[right - left]) ++right;
            za[i] = right - left; --right;
        }
    }
    std::string out; out.reserve(src.size());
    for (size_t i = sz + 1; i < from.size(); ++i) {
        if (za[i] >= sz) {
            out.append(to);
            i += sz - 1;
        } else {
            out.push_back(from[i]);
        }
    }
    return out;
}